

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

bool __thiscall wasm::anon_unknown_0::SubTyper::isSubType(SubTyper *this,Type a,Type b)

{
  pointer pTVar1;
  bool bVar2;
  Tuple *pTVar3;
  Tuple *pTVar4;
  HeapType this_00;
  HeapType a_00;
  uintptr_t extraout_RDX;
  Type b_00;
  uintptr_t extraout_RDX_00;
  uintptr_t extraout_RDX_01;
  uintptr_t extraout_RDX_02;
  HeapType b_01;
  size_t i;
  ulong uVar5;
  bool bVar6;
  Type local_40;
  Type b_local;
  HeapType heapTypeA;
  Type a_local;
  
  if (this == (SubTyper *)0x1 || this == (SubTyper *)a.id) {
    return true;
  }
  local_40.id = a.id;
  heapTypeA.id = (uintptr_t)this;
  if (((ulong)this & 1) == 0 || this < (SubTyper *)0x7) {
    if (((((ulong)this & 1) == 0 && (SubTyper *)0x6 < this) && ((a.id & 1) == 0 && 6 < a.id)) &&
       (((byte)this >> 1 & (a.id & 2) == 0) == 0)) {
      this_00 = wasm::Type::getHeapType((Type *)&heapTypeA);
      b_local.id = this_00.id;
      a_00 = wasm::Type::getHeapType(&local_40);
      bVar6 = wasm::Type::isExact(&local_40);
      b_01.id = extraout_RDX_01;
      if (bVar6) {
        bVar6 = wasm::Type::isExact((Type *)&heapTypeA);
        if (bVar6) {
          return this_00.id == a_00.id;
        }
        bVar6 = HeapType::isBottom((HeapType *)&b_local);
        b_01.id = extraout_RDX_02;
        this_00.id = b_local.id;
        if (!bVar6) {
          return false;
        }
      }
      bVar6 = isSubType((SubTyper *)this_00.id,a_00,b_01);
      return bVar6;
    }
  }
  else if ((a.id & 1) != 0 && 6 < a.id) {
    pTVar3 = wasm::Type::getTuple((Type *)&heapTypeA);
    pTVar4 = wasm::Type::getTuple(&local_40);
    if ((long)(pTVar3->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pTVar3->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
              super__Vector_impl_data._M_start ==
        (long)(pTVar4->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pTVar4->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
              super__Vector_impl_data._M_start) {
      uVar5 = 0;
      b_00.id = extraout_RDX;
      do {
        pTVar1 = (pTVar3->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        bVar6 = (ulong)((long)(pTVar3->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) <=
                uVar5;
        if (bVar6) {
          return bVar6;
        }
        bVar2 = isSubType((SubTyper *)pTVar1[uVar5].id,
                          (Type)(pTVar4->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar5].id,b_00);
        uVar5 = uVar5 + 1;
        b_00.id = extraout_RDX_00;
      } while (bVar2);
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool SubTyper::isSubType(Type a, Type b) {
  if (a == b) {
    return true;
  }
  if (a == Type::unreachable) {
    return true;
  }
  if (a.isTuple() && b.isTuple()) {
    return isSubType(a.getTuple(), b.getTuple());
  }
  if (!a.isRef() || !b.isRef()) {
    return false;
  }
  if (a.isNullable() && !b.isNullable()) {
    return false;
  }
  auto heapTypeA = a.getHeapType();
  auto heapTypeB = b.getHeapType();
  if (b.isExact()) {
    if (a.isExact()) {
      return heapTypeA == heapTypeB;
    }
    if (!heapTypeA.isBottom()) {
      return false;
    }
  }
  return isSubType(heapTypeA, heapTypeB);
}